

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# textures.cpp
# Opt level: O1

string * __thiscall
pbrt::WrinkledTexture::ToString_abi_cxx11_(string *__return_storage_ptr__,WrinkledTexture *this)

{
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  detail::stringPrintfRecursive<pbrt::TextureMapping3DHandle_const&,int_const&,float_const&>
            (__return_storage_ptr__,"[ WrinkledTexture mapping: %s octaves: %d omega: %f ]",
             &this->mapping,&this->octaves,&this->omega);
  return __return_storage_ptr__;
}

Assistant:

std::string WrinkledTexture::ToString() const {
    return StringPrintf("[ WrinkledTexture mapping: %s octaves: %d "
                        "omega: %f ]",
                        mapping, octaves, omega);
}